

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O1

void prepare_1_cb(uv_prepare_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  fputs("PREPARE_1_CB\n",_stderr);
  fflush(_stderr);
  if (handle != &prepare_1_handle) {
    pcVar3 = "handle == &prepare_1_handle";
    uVar2 = 0x10b;
LAB_0012eba2:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-loop-handles.c"
            ,uVar2,pcVar3);
    abort();
  }
  if ((loop_iteration & 1U) == 0) {
    iVar1 = uv_prepare_start(&prepare_2_handle,prepare_2_cb);
    if (iVar1 != 0) {
      pcVar3 = "r == 0";
      uVar2 = 0x10f;
      goto LAB_0012eba2;
    }
  }
  prepare_1_cb_called = prepare_1_cb_called + 1;
  loop_iteration = loop_iteration + 1;
  printf("Loop iteration %d of %d.\n",(ulong)(uint)loop_iteration,0x15);
  return;
}

Assistant:

static void prepare_1_cb(uv_prepare_t* handle) {
  int r;

  fprintf(stderr, "%s", "PREPARE_1_CB\n");
  fflush(stderr);
  ASSERT(handle == &prepare_1_handle);

  if (loop_iteration % 2 == 0) {
    r = uv_prepare_start(&prepare_2_handle, prepare_2_cb);
    ASSERT(r == 0);
  }

  prepare_1_cb_called++;
  loop_iteration++;

  printf("Loop iteration %d of %d.\n", loop_iteration, ITERATIONS);
}